

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O0

void __thiscall
CreateMagicMatchRuleResult::CreateMagicMatchRuleResult
          (CreateMagicMatchRuleResult *this,QStringView type,QStringView value,QStringView offsets,
          QStringView mask)

{
  long lVar1;
  long in_FS_OFFSET;
  QString *in_stack_00000058;
  QByteArray *in_stack_00000060;
  QString *in_stack_00000068;
  QByteArray *in_stack_00000070;
  QString *in_stack_00000078;
  QMimeMagicRule *in_stack_00000080;
  QStringView *in_stack_ffffffffffffff30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x911e72);
  QStringView::toString(in_stack_ffffffffffffff30);
  QStringView::toUtf8(in_stack_ffffffffffffff30);
  QStringView::toString(in_stack_ffffffffffffff30);
  QStringView::toLatin1(in_stack_ffffffffffffff30);
  QMimeMagicRule::QMimeMagicRule
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
             in_stack_00000060,in_stack_00000058);
  QByteArray::~QByteArray((QByteArray *)0x911f05);
  QString::~QString((QString *)0x911f0f);
  QByteArray::~QByteArray((QByteArray *)0x911f1c);
  QString::~QString((QString *)0x911f29);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CreateMagicMatchRuleResult(QStringView type, QStringView value, QStringView offsets, QStringView mask)
        : errorMessage(), rule(type.toString(), value.toUtf8(), offsets.toString(), mask.toLatin1(), &errorMessage)
    {

    }